

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t psa_mac_verify_finish(psa_mac_operation_t *operation,uint8_t *mac,size_t mac_length)

{
  psa_status_t pVar1;
  int iVar2;
  uint8_t actual_mac [64];
  
  if (operation->alg == 0) {
    return -0x89;
  }
  if ((operation->field_0x4 & 0x10) != 0) {
    return -0x89;
  }
  pVar1 = -0x95;
  if ((operation->mac_size == mac_length) &&
     (pVar1 = psa_mac_finish_internal(operation,actual_mac,0x40), pVar1 == 0)) {
    iVar2 = safer_memcmp(mac,actual_mac,mac_length);
    pVar1 = -0x95;
    if (iVar2 == 0) {
      pVar1 = psa_mac_abort(operation);
      goto LAB_00127cb6;
    }
  }
  psa_mac_abort(operation);
LAB_00127cb6:
  mbedtls_platform_zeroize(actual_mac,0x40);
  return pVar1;
}

Assistant:

psa_status_t psa_mac_verify_finish( psa_mac_operation_t *operation,
                                    const uint8_t *mac,
                                    size_t mac_length )
{
    uint8_t actual_mac[PSA_MAC_MAX_SIZE];
    psa_status_t status;

    if( operation->alg == 0 )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    if( operation->is_sign )
    {
        return( PSA_ERROR_BAD_STATE );
    }
    if( operation->mac_size != mac_length )
    {
        status = PSA_ERROR_INVALID_SIGNATURE;
        goto cleanup;
    }

    status = psa_mac_finish_internal( operation,
                                      actual_mac, sizeof( actual_mac ) );
    if( status != PSA_SUCCESS )
        goto cleanup;

    if( safer_memcmp( mac, actual_mac, mac_length ) != 0 )
        status = PSA_ERROR_INVALID_SIGNATURE;

cleanup:
    if( status == PSA_SUCCESS )
        status = psa_mac_abort( operation );
    else
        psa_mac_abort( operation );

    mbedtls_platform_zeroize( actual_mac, sizeof( actual_mac ) );

    return( status );
}